

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::ConvertFloatImpl
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  longdouble v_local;
  
  bVar1 = anon_unknown_0::FloatToSink<long_double>(v,conv,sink);
  return bVar1;
}

Assistant:

bool ConvertFloatImpl(long double v, const FormatConversionSpecImpl &conv,
                      FormatSinkImpl *sink) {
  if (IsDoubleDouble()) {
    // This is the `double-double` representation of `long double`. We do not
    // handle it natively. Fallback to snprintf.
    return FallbackToSnprintf(v, conv, sink);
  }

  return FloatToSink(v, conv, sink);
}